

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Kss_Emu::run_clocks(Kss_Emu *this,blip_time_t *duration,int param_3)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  time_t tVar4;
  time_t *in_RSI;
  time_t *__timer;
  Kss_Emu *in_RDI;
  blip_time_t end;
  cpu_time_t in_stack_0000026c;
  Kss_Cpu *in_stack_00000270;
  Kss_Cpu *in_stack_ffffffffffffffd8;
  blip_time_t time;
  
  __timer = in_RSI;
  while( true ) {
    time = (blip_time_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    tVar4 = Kss_Cpu::time(&in_RDI->super_Kss_Cpu,__timer);
    if ((int)*in_RSI <= (int)tVar4) break;
    uVar2 = ::min((int)*in_RSI,in_RDI->next_play);
    in_stack_ffffffffffffffd8 = &in_RDI->super_Kss_Cpu;
    uVar3 = ::min((int)*in_RSI,in_RDI->next_play);
    __timer = (time_t *)(ulong)uVar3;
    Kss_Cpu::run(in_stack_00000270,in_stack_0000026c);
    if ((in_RDI->super_Kss_Cpu).r.pc == 0xffff) {
      __timer = (time_t *)(ulong)uVar2;
      Kss_Cpu::set_time(&in_RDI->super_Kss_Cpu,uVar2);
    }
    tVar4 = Kss_Cpu::time(&in_RDI->super_Kss_Cpu,__timer);
    if ((in_RDI->next_play <= (int)tVar4) &&
       (in_RDI->next_play = in_RDI->play_period + in_RDI->next_play,
       (in_RDI->super_Kss_Cpu).r.pc == 0xffff)) {
      if (((in_RDI->gain_updated & 1U) == 0) &&
         (in_RDI->gain_updated = true, (in_RDI->scc_accessed & 1U) != 0)) {
        update_gain(in_RDI);
      }
      uVar1 = (in_RDI->super_Kss_Cpu).r.sp - 1;
      (in_RDI->super_Kss_Cpu).r.sp = uVar1;
      in_RDI->ram[uVar1] = 0xff;
      uVar1 = (in_RDI->super_Kss_Cpu).r.sp - 1;
      (in_RDI->super_Kss_Cpu).r.sp = uVar1;
      in_RDI->ram[uVar1] = 0xff;
      uVar2 = get_le16((in_RDI->header_).super_header_t.play_addr);
      (in_RDI->super_Kss_Cpu).r.pc = (uint16_t)uVar2;
    }
  }
  tVar4 = Kss_Cpu::time(&in_RDI->super_Kss_Cpu,__timer);
  *(int *)in_RSI = (int)tVar4;
  in_RDI->next_play = in_RDI->next_play - (int)*in_RSI;
  Kss_Cpu::adjust_time(&in_RDI->super_Kss_Cpu,-(int)*in_RSI);
  Ay_Apu::end_frame((Ay_Apu *)in_RDI,time);
  Scc_Apu::end_frame((Scc_Apu *)in_RDI,time);
  if (in_RDI->sn != (Sms_Apu *)0x0) {
    Sms_Apu::end_frame((Sms_Apu *)in_RDI,time);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Kss_Emu::run_clocks( blip_time_t& duration, int )
{
	while ( time() < duration )
	{
		blip_time_t end = min( duration, next_play );
		cpu::run( min( duration, next_play ) );
		if ( r.pc == idle_addr )
			set_time( end );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			if ( r.pc == idle_addr )
			{
				if ( !gain_updated )
				{
					gain_updated = true;
					if ( scc_accessed )
						update_gain();
				}
				
				ram [--r.sp] = idle_addr >> 8;
				ram [--r.sp] = idle_addr & 0xFF;
				r.pc = get_le16( header_.play_addr );
				GME_FRAME_HOOK( this );
			}
		}
	}
	
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	ay.end_frame( duration );
	scc.end_frame( duration );
	if ( sn )
		sn->end_frame( duration );
	
	return 0;
}